

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::
GenerateNewReflectiveBlockingServiceMethod(ImmutableServiceGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  io::Printer::Print<>
            (printer,
             "public static com.google.protobuf.BlockingService\n    newReflectiveBlockingService(final BlockingInterface impl) {\n  return new com.google.protobuf.BlockingService() {\n"
            );
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  GenerateGetDescriptorForType(this,printer);
  GenerateCallBlockingMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"};\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveBlockingServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.BlockingService\n"
      "    newReflectiveBlockingService(final BlockingInterface impl) {\n"
      "  return new com.google.protobuf.BlockingService() {\n");
  printer->Indent();
  printer->Indent();

  GenerateGetDescriptorForType(printer);

  GenerateCallBlockingMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}